

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

box3f * __thiscall
pbrt::Curve::getPrimBounds(box3f *__return_storage_ptr__,Curve *this,size_t param_1,affine3f *xfm)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  pointer pvVar19;
  pointer pvVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  (__return_storage_ptr__->lower).x = 3.4028235e+38;
  (__return_storage_ptr__->lower).y = 3.4028235e+38;
  *(undefined8 *)&(__return_storage_ptr__->lower).z = 0xff7fffff7f7fffff;
  (__return_storage_ptr__->upper).y = -3.4028235e+38;
  (__return_storage_ptr__->upper).z = -3.4028235e+38;
  pvVar20 = (this->P).super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pvVar19 = (this->P).super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  fVar24 = (__return_storage_ptr__->lower).z;
  if (pvVar20 == pvVar19) {
    fVar22 = -3.4028235e+38;
  }
  else {
    uVar1 = (xfm->l).vx.x;
    uVar10 = (xfm->l).vx.y;
    uVar2 = (xfm->l).vy.x;
    uVar11 = (xfm->l).vy.y;
    uVar3 = (xfm->l).vz.x;
    uVar12 = (xfm->l).vz.y;
    uVar4 = (xfm->p).x;
    uVar13 = (xfm->p).y;
    uVar5 = (__return_storage_ptr__->lower).x;
    uVar14 = (__return_storage_ptr__->lower).y;
    auVar28._4_4_ = uVar14;
    auVar28._0_4_ = uVar5;
    auVar28._8_8_ = 0;
    uVar6 = (__return_storage_ptr__->upper).x;
    uVar15 = (__return_storage_ptr__->upper).y;
    auVar26._4_4_ = uVar15;
    auVar26._0_4_ = uVar6;
    auVar26._8_8_ = 0;
    fVar21 = -3.4028235e+38;
    fVar23 = fVar24;
    do {
      fVar24 = pvVar20->x;
      uVar7 = pvVar20->y;
      uVar16 = pvVar20->z;
      fVar22 = (float)uVar16 * (xfm->l).vz.z + fVar24 * (xfm->l).vx.z + (float)uVar7 * (xfm->l).vy.z
               + (xfm->p).z;
      auVar25._0_8_ =
           CONCAT44((float)uVar16 * (float)uVar12 +
                    (float)uVar7 * (float)uVar11 + fVar24 * (float)uVar10 + (float)uVar13,
                    (float)uVar16 * (float)uVar3 +
                    (float)uVar7 * (float)uVar2 + fVar24 * (float)uVar1 + (float)uVar4);
      auVar25._8_4_ = (float)uVar16 * 0.0 + (float)uVar7 * 0.0 + fVar24 * 0.0 + 0.0;
      auVar25._12_4_ = (float)uVar16 * 0.0 + (float)uVar7 * 0.0 + fVar24 * 0.0 + 0.0;
      auVar27._8_4_ = auVar25._8_4_;
      auVar27._0_8_ = auVar25._0_8_;
      auVar27._12_4_ = auVar25._12_4_;
      auVar28 = minps(auVar27,auVar28);
      fVar24 = fVar22;
      if (fVar23 <= fVar22) {
        fVar24 = fVar23;
      }
      auVar26 = maxps(auVar25,auVar26);
      if (fVar22 <= fVar21) {
        fVar22 = fVar21;
      }
      pvVar20 = pvVar20 + 1;
      fVar21 = fVar22;
      fVar23 = fVar24;
    } while (pvVar20 != pvVar19);
    (__return_storage_ptr__->lower).x = (float)(int)auVar28._0_8_;
    (__return_storage_ptr__->lower).y = (float)(int)((ulong)auVar28._0_8_ >> 0x20);
    (__return_storage_ptr__->upper).x = (float)(int)auVar26._0_8_;
    (__return_storage_ptr__->upper).y = (float)(int)((ulong)auVar26._0_8_ >> 0x20);
  }
  (__return_storage_ptr__->lower).z = fVar24;
  (__return_storage_ptr__->upper).z = fVar22;
  fVar21 = this->width1;
  if (this->width1 <= this->width0) {
    fVar21 = this->width0;
  }
  uVar8 = (__return_storage_ptr__->lower).x;
  uVar17 = (__return_storage_ptr__->lower).y;
  uVar9 = (__return_storage_ptr__->upper).x;
  uVar18 = (__return_storage_ptr__->upper).y;
  (__return_storage_ptr__->lower).x = (float)uVar8 - fVar21;
  (__return_storage_ptr__->lower).y = (float)uVar17 - fVar21;
  (__return_storage_ptr__->lower).z = fVar24 - fVar21;
  (__return_storage_ptr__->upper).x = (float)uVar9 + fVar21;
  (__return_storage_ptr__->upper).y = (float)uVar18 + fVar21;
  (__return_storage_ptr__->upper).z = fVar21 + fVar22;
  return __return_storage_ptr__;
}

Assistant:

box3f Curve::getPrimBounds(const size_t /*unused: primID*/, const affine3f &xfm) 
  {
    box3f primBounds = box3f::empty_box();
    for (auto p : P)
      primBounds.extend(xfmPoint(xfm,p));
    vec3f maxWidth = vec3f(std::max(width0,width1));
    primBounds.lower = primBounds.lower - maxWidth;
    primBounds.upper = primBounds.upper + maxWidth;
    return primBounds;
  }